

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O2

int FmsIOWriteFmsMetaData(FmsIOContext *ctx,FmsIOFunctions *io,char *key,FmsMetaData mdata)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  FmsInt size;
  FmsIntType int_type;
  void *data;
  FmsMetaDataType type;
  char *local_50;
  char *mdata_name;
  
  iVar1 = FmsMetaDataGetType(mdata,&type);
  if (iVar1 < 2) {
    iVar3 = 0;
    iVar4 = 0;
    if (iVar1 != 1) {
      pcVar2 = join_keys(key,"MetaDataType");
      (*io->add_string)(ctx,pcVar2,FmsMetaDataTypeNames[type]);
      free(pcVar2);
      iVar4 = iVar3;
      switch(type) {
      case FMS_INTEGER:
        mdata_name = (char *)0x0;
        data = (void *)0x0;
        iVar1 = FmsMetaDataGetIntegers(mdata,&mdata_name,&int_type,&size,&data);
        if (iVar1 == 0) {
          pcVar2 = join_keys(key,"Name");
          iVar1 = (*io->add_string)(ctx,pcVar2,mdata_name);
          free(pcVar2);
          if (iVar1 == 0) {
            pcVar2 = join_keys(key,"Data");
            iVar1 = (*io->add_typed_int_array)(ctx,pcVar2,int_type,data,size);
            free(pcVar2);
            if (iVar1 != 0) {
              iVar4 = 5;
            }
          }
          else {
            iVar4 = 4;
          }
        }
        else {
          iVar4 = 3;
        }
        break;
      case FMS_SCALAR:
        mdata_name = (char *)0x0;
        data = (void *)0x0;
        iVar1 = FmsMetaDataGetScalars(mdata,&mdata_name,&int_type,&size,&data);
        if (iVar1 == 0) {
          pcVar2 = join_keys(key,"Name");
          iVar1 = (*io->add_string)(ctx,pcVar2,mdata_name);
          free(pcVar2);
          if (iVar1 == 0) {
            pcVar2 = join_keys(key,"Data");
            iVar1 = (*io->add_scalar_array)(ctx,pcVar2,int_type,data,size);
            free(pcVar2);
            if (iVar1 != 0) {
              iVar4 = 8;
            }
          }
          else {
            iVar4 = 7;
          }
        }
        else {
          iVar4 = 6;
        }
        break;
      case FMS_STRING:
        mdata_name = (char *)0x0;
        size = 0;
        iVar1 = FmsMetaDataGetString(mdata,&mdata_name,(char **)&size);
        if (iVar1 == 0) {
          pcVar2 = join_keys(key,"Name");
          iVar1 = (*io->add_string)(ctx,pcVar2,mdata_name);
          free(pcVar2);
          if (iVar1 == 0) {
            pcVar2 = join_keys(key,"Data");
            iVar1 = (*io->add_string)(ctx,pcVar2,(char *)size);
            free(pcVar2);
            if (iVar1 != 0) {
              iVar4 = 0xb;
            }
          }
          else {
            iVar4 = 10;
          }
        }
        else {
          iVar4 = 9;
        }
        break;
      case FMS_META_DATA:
        size = 0;
        data = (void *)0x0;
        _int_type = (FmsMetaData *)0x0;
        iVar1 = FmsMetaDataGetMetaData
                          (mdata,(char **)&size,(FmsInt *)&data,(FmsMetaData **)&int_type);
        if (iVar1 == 0) {
          if (_int_type == (FmsMetaData *)0x0) {
            iVar4 = 0xd;
          }
          else {
            pcVar2 = join_keys(key,"Name");
            iVar1 = (*io->add_string)(ctx,pcVar2,(char *)size);
            free(pcVar2);
            if (iVar1 == 0) {
              pcVar2 = join_keys(key,"Size");
              iVar1 = (*io->add_int)(ctx,pcVar2,(FmsInt)data);
              free(pcVar2);
              if (iVar1 == 0) {
                local_50 = join_keys(key,"Data");
                for (pvVar5 = (void *)0x0; pvVar5 < data; pvVar5 = (void *)((long)pvVar5 + 1)) {
                  sprintf((char *)&mdata_name,"%d",(ulong)pvVar5 & 0xffffffff);
                  pcVar2 = join_keys(local_50,(char *)&mdata_name);
                  iVar1 = FmsIOWriteFmsMetaData(ctx,io,pcVar2,_int_type[(long)pvVar5]);
                  free(pcVar2);
                  if (iVar1 != 0) {
                    free(local_50);
                    return 0x10;
                  }
                }
                free(local_50);
              }
              else {
                iVar4 = 0xf;
              }
            }
            else {
              iVar4 = 0xe;
            }
          }
        }
        else {
          iVar4 = 0xc;
        }
        break;
      default:
        iVar4 = 0x11;
      }
    }
  }
  else {
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

static int
FmsIOWriteFmsMetaData(FmsIOContext *ctx, FmsIOFunctions *io, const char *key,
                      FmsMetaData mdata) {
  int err = 0;
  FmsMetaDataType type;

  /* It says it returns 1 if mdata is empty, but then just checks if its null (if im not mistaken).
      We already null checked before we got here so I'm not sure if we need to check for 1. */
  int r = FmsMetaDataGetType(mdata, &type);
  if(r > 1)
    E_RETURN(1);
  else if(r == 1)
    return 0;

  char *kmdtype = join_keys(key, "MetaDataType");
  (*io->add_string)(ctx, kmdtype, FmsMetaDataTypeNames[type]);
  FREE(kmdtype);

  switch(type) {
  case FMS_INTEGER: {
    char *kname = NULL, *kdata = NULL;
    const char *mdata_name = NULL;
    FmsIntType int_type;
    FmsInt size;
    const void *data = NULL;

    if(FmsMetaDataGetIntegers(mdata, &mdata_name, &int_type, &size, &data))
      E_RETURN(3);

    kname = join_keys(key, "Name");
    err = (*io->add_string)(ctx, kname, mdata_name);
    FREE(kname);
    if (err) { E_RETURN(4); }

    kdata = join_keys(key, "Data");
    err = (*io->add_typed_int_array)(ctx, kdata, int_type, data, size);
    FREE(kdata);
    if (err) { E_RETURN(5); }
    break;
  }
  case FMS_SCALAR: {
    char *kname = NULL, *kdata = NULL;
    const char *mdata_name = NULL;
    FmsScalarType scalar_type;
    FmsInt size;
    const void *data = NULL;

    if(FmsMetaDataGetScalars(mdata, &mdata_name, &scalar_type, &size, &data))
      E_RETURN(6);

    kname = join_keys(key, "Name");
    err = (*io->add_string)(ctx, kname, mdata_name);
    FREE(kname);
    if (err) { E_RETURN(7); }

    kdata = join_keys(key, "Data");
    err = (*io->add_scalar_array)(ctx, kdata, scalar_type, data, size);
    FREE(kdata);
    if (err) { E_RETURN(8); }
    break;
  }
  case FMS_STRING: {
    char *kname = NULL, *kdata = NULL;
    const char *mdata_name = NULL;
    const char *data = NULL;

    if(FmsMetaDataGetString(mdata, &mdata_name, &data))
      E_RETURN(9);

    kname = join_keys(key, "Name");
    err = (*io->add_string)(ctx, kname, mdata_name);
    FREE(kname);
    if (err) { E_RETURN(10); }

    kdata = join_keys(key, "Data");
    err = (*io->add_string)(ctx, kdata, data);
    FREE(kdata);
    if (err) { E_RETURN(11); }
    break;
  }
  case FMS_META_DATA: {
    char *kname = NULL, *kdata = NULL, *ksize = NULL;
    const char *mdata_name = NULL;
    FmsInt i, size = 0;
    FmsMetaData *data = NULL;

    if(FmsMetaDataGetMetaData(mdata, &mdata_name, &size, &data))
      E_RETURN(12);

    if (!data) { E_RETURN(13); }

    kname = join_keys(key, "Name");
    err = (*io->add_string)(ctx, kname, mdata_name);
    FREE(kname);
    if (err) { E_RETURN(14); }

    ksize = join_keys(key, "Size");
    err = (*io->add_int)(ctx, ksize, size);
    FREE(ksize);
    if (err) { E_RETURN(15); }

    kdata = join_keys(key, "Data");
    // Recursive?
    for(i = 0; i < size; i++) {
      char temp[20], *tk = NULL;
      sprintf(temp, "%d", (int)i);
      tk = join_keys(kdata, temp);
      err = FmsIOWriteFmsMetaData(ctx, io, tk, data[i]);
      FREE(tk);
      if (err) {
        FREE(kdata);
        E_RETURN(16);
      }
    }
    FREE(kdata);
    break;
  }
  default:
    E_RETURN(17);
    break;
  }
  return 0;
}